

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

void __thiscall soul::Value::copyValue(Value *this,Value *source)

{
  ArrayWithPreallocation<unsigned_char,_8UL> *pAVar1;
  uchar *__dest;
  bool bVar2;
  
  bVar2 = Type::isEqual(&this->type,&source->type,0);
  if (bVar2) {
    pAVar1 = &(this->allocatedData).allocatedData;
    if ((this->allocatedData).allocatedData.numActive == 0) {
      ArrayWithPreallocation<unsigned_char,_8UL>::resize(pAVar1,(this->allocatedData).allocatedSize)
      ;
    }
    __dest = pAVar1->items;
    pAVar1 = &(source->allocatedData).allocatedData;
    if ((source->allocatedData).allocatedData.numActive == 0) {
      ArrayWithPreallocation<unsigned_char,_8UL>::resize
                (pAVar1,(source->allocatedData).allocatedSize);
    }
    memcpy(__dest,pAVar1->items,(this->allocatedData).allocatedSize);
    return;
  }
  throwInternalCompilerError("copyValue",0x27b);
}

Assistant:

void Value::copyValue (const Value& source)
{
    if (type.isIdentical (source.type))
    {
        memcpy (allocatedData.data(), source.allocatedData.data(), allocatedData.size());
        return;
    }

    SOUL_ASSERT_FALSE;
}